

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

ModportClockingSymbol *
slang::ast::ModportClockingSymbol::fromSyntax(ASTContext *context,ModportClockingPortSyntax *syntax)

{
  string_view arg;
  Compilation *this;
  SourceLocation SVar1;
  Symbol *pSVar2;
  Diagnostic *this_00;
  SyntaxNode *in_RSI;
  SourceLocation in_RDI;
  LookupLocation LVar3;
  SourceRange SVar4;
  string_view sVar5;
  Diagnostic *diag;
  ModportClockingSymbol *result;
  Token name;
  Compilation *comp;
  Scope *in_stack_00000248;
  bitmask<slang::ast::LookupFlags> in_stack_00000254;
  LookupLocation in_stack_00000258;
  string_view in_stack_00000268;
  SourceRange in_stack_00000290;
  ASTContext *in_stack_ffffffffffffff00;
  SourceLocation this_01;
  Token *in_stack_ffffffffffffff10;
  SourceLocation this_02;
  undefined8 in_stack_ffffffffffffff30;
  DiagCode DVar6;
  SourceLocation SVar7;
  bitmask<slang::ast::LookupFlags> local_8c;
  SourceRange local_88;
  Scope *local_78;
  uint32_t local_70;
  Scope *local_68;
  uint32_t local_60;
  string_view local_58;
  SourceLocation local_48;
  string_view local_40;
  ModportClockingSymbol *local_30;
  undefined8 local_28;
  SyntaxNode *pSStack_20;
  Compilation *local_18;
  SyntaxNode *local_10;
  SourceLocation local_8;
  
  DVar6 = SUB84((ulong)in_stack_ffffffffffffff30 >> 0x20,0);
  local_10 = in_RSI;
  local_8 = in_RDI;
  this = ASTContext::getCompilation((ASTContext *)0x3e0e84);
  local_28 = *(undefined8 *)(local_10 + 4);
  pSStack_20 = local_10[4].parent;
  this_02 = (SourceLocation)&local_28;
  local_18 = this;
  local_40 = parsing::Token::valueText(in_stack_ffffffffffffff10);
  local_48 = parsing::Token::location((Token *)this_02);
  local_30 = BumpAllocator::
             emplace<slang::ast::ModportClockingSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                       ((BumpAllocator *)this_02,
                        (basic_string_view<char,_std::char_traits<char>_> *)this,
                        (SourceLocation *)in_stack_ffffffffffffff10);
  Symbol::setSyntax(&local_30->super_Symbol,local_10);
  SVar1 = (SourceLocation)
          not_null<const_slang::ast::Scope_*>::operator*
                    ((not_null<const_slang::ast::Scope_*> *)0x3e0f25);
  local_58 = parsing::Token::valueText(in_stack_ffffffffffffff10);
  LVar3 = ASTContext::getLocation(in_stack_ffffffffffffff00);
  local_78 = LVar3.scope;
  local_70 = LVar3.index;
  local_68 = local_78;
  local_60 = local_70;
  local_88 = parsing::Token::range((Token *)this_02);
  bitmask<slang::ast::LookupFlags>::bitmask(&local_8c,NoParentScope);
  this_01 = local_88.endLoc;
  pSVar2 = Lookup::unqualifiedAt
                     (in_stack_00000248,in_stack_00000268,in_stack_00000258,in_stack_00000290,
                      in_stack_00000254);
  local_30->target = pSVar2;
  if ((local_30->target != (Symbol *)0x0) && (local_30->target->kind != ClockingBlock)) {
    SVar4 = parsing::Token::range((Token *)this_02);
    SVar7 = SVar4.startLoc;
    SVar4.endLoc = SVar1;
    SVar4.startLoc = this_02;
    this_00 = ASTContext::addDiag((ASTContext *)this,DVar6,SVar4);
    sVar5 = parsing::Token::valueText((Token *)this_00);
    DVar6 = SUB84((ulong)this_00 >> 0x20,0);
    arg._M_str = (char *)SVar7;
    arg._M_len = (size_t)sVar5._M_str;
    Diagnostic::operator<<((Diagnostic *)sVar5._M_len,arg);
    Diagnostic::addNote((Diagnostic *)this_01,DVar6,local_8);
    local_30->target = (Symbol *)0x0;
  }
  return local_30;
}

Assistant:

ModportClockingSymbol& ModportClockingSymbol::fromSyntax(const ASTContext& context,
                                                         const ModportClockingPortSyntax& syntax) {
    auto& comp = context.getCompilation();
    auto name = syntax.name;
    auto result = comp.emplace<ModportClockingSymbol>(name.valueText(), name.location());
    result->setSyntax(syntax);

    result->target = Lookup::unqualifiedAt(*context.scope, name.valueText(), context.getLocation(),
                                           name.range(), LookupFlags::NoParentScope);

    if (result->target && result->target->kind != SymbolKind::ClockingBlock) {
        auto& diag = context.addDiag(diag::NotAClockingBlock, name.range());
        diag << name.valueText();
        diag.addNote(diag::NoteDeclarationHere, result->target->location);
        result->target = nullptr;
    }

    return *result;
}